

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O3

void __thiscall
BailOutRecord::AdjustOffsetsForDiagMode
          (BailOutRecord *this,JavascriptCallStackLayout *layout,ScriptFunction *function)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  Utf8SourceInfo *pUVar4;
  GlobalBailOutRecordDataTable *pGVar5;
  GlobalBailOutRecordDataRow *pGVar6;
  code *pcVar7;
  bool bVar8;
  uint32 uVar9;
  FunctionBody *this_00;
  undefined4 *puVar10;
  FunctionEntryPointInfo *pFVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  int local_34;
  
  this_00 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  if (this_00 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x324,"(functionBody != nullptr)","functionBody != nullptr");
    if (!bVar8) goto LAB_003f84bb;
    *puVar10 = 0;
  }
  pUVar4 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  bVar1 = pUVar4->field_0xa8;
  if ((byte)((bVar1 >> 5 | (pUVar4->debugModeSource).ptr != (uchar *)0x0) & (bVar1 & 0x40) >> 6) ==
      0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x326,"(functionBody->IsInDebugMode())","functionBody->IsInDebugMode()");
    if (!bVar8) goto LAB_003f84bb;
    *puVar10 = 0;
  }
  pFVar11 = Js::FunctionBody::GetDefaultFunctionEntryPointInfo(this_00);
  if (pFVar11 == (FunctionEntryPointInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x329,"(entryPointInfo != nullptr)","entryPointInfo != nullptr");
    if (!bVar8) goto LAB_003f84bb;
    *puVar10 = 0;
  }
  if (pFVar11->localVarChangedOffset != -1) {
    uVar9 = Js::FunctionBody::GetNonTempLocalVarCount(this_00);
    if (uVar9 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x32e,"(functionBody->GetNonTempLocalVarCount() != 0)",
                         "functionBody->GetNonTempLocalVarCount() != 0");
      if (!bVar8) {
LAB_003f84bb:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar10 = 0;
    }
    pcVar12 = Js::JavascriptCallStackLayout::GetValueChangeOffset
                        (layout,pFVar11->localVarChangedOffset);
    if (*pcVar12 == '\x01') {
      pGVar5 = this->globalBailOutRecordTable;
      uVar9 = pGVar5->length;
      if (uVar9 != 0) {
        uVar2 = this->m_bailOutRecordId;
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        lVar14 = 0;
        uVar13 = 0;
        do {
          pGVar6 = pGVar5->globalBailOutRecordDataRows;
          if (uVar2 <= *(uint *)((long)&pGVar6->end + lVar14)) {
            if (uVar2 < *(uint *)((long)&pGVar6->start + lVar14)) {
              return;
            }
            iVar3 = *(int *)((long)&pGVar6->offset + lVar14);
            if (iVar3 == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                 ,0x339,"(offset != 0)","offset != 0");
              if (!bVar8) goto LAB_003f84bb;
              *puVar10 = 0;
            }
            bVar8 = Js::FunctionBody::GetSlotOffset
                              (this_00,*(uint *)(&pGVar6->field_0xc + lVar14) & 0x3fffffff,&local_34
                               ,false);
            if (bVar8) {
              local_34 = local_34 + pFVar11->localVarSlotsOffset;
              if ((iVar3 < 1) && (iVar3 != local_34)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar10 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                   ,0x33f,"(offset > 0 || offset == slotOffset)",
                                   "offset > 0 || offset == slotOffset");
                if (!bVar8) goto LAB_003f84bb;
                *puVar10 = 0;
              }
              *(int *)((long)&pGVar6->offset + lVar14) = local_34;
            }
            uVar9 = pGVar5->length;
          }
          uVar13 = uVar13 + 1;
          lVar14 = lVar14 + 0x10;
        } while (uVar13 < uVar9);
      }
    }
  }
  return;
}

Assistant:

void
BailOutRecord::AdjustOffsetsForDiagMode(Js::JavascriptCallStackLayout * layout, Js::ScriptFunction * function) const
{
    // In this function we are going to do
    // 1. Check if the value got changed (by checking at the particular location at the stack)
    // 2. In that case update the offset to point to the stack offset

    Js::FunctionBody *functionBody =  function->GetFunctionBody();
    Assert(functionBody != nullptr);

    Assert(functionBody->IsInDebugMode());

    Js::FunctionEntryPointInfo *entryPointInfo = functionBody->GetDefaultFunctionEntryPointInfo();
    Assert(entryPointInfo != nullptr);

    // Note: the offset may be not initialized/InvalidOffset when there are no non-temp local vars.
    if (entryPointInfo->localVarChangedOffset != Js::Constants::InvalidOffset)
    {
        Assert(functionBody->GetNonTempLocalVarCount() != 0);

        char * valueChangeOffset = layout->GetValueChangeOffset(entryPointInfo->localVarChangedOffset);
        if (*valueChangeOffset == Js::FunctionBody::LocalsChangeDirtyValue)
        {
            // The value got changed due to debugger, lets read values from the stack position
            // Get the corresponding offset on the stack related to the frame.

            globalBailOutRecordTable->IterateGlobalBailOutRecordTableRows(m_bailOutRecordId, [=](GlobalBailOutRecordDataRow *row) {
                int32 offset = row->offset;
                // offset is zero, is it possible that a locals is not living in the debug mode?
                Assert(offset != 0);
                int32 slotOffset;
                if (functionBody->GetSlotOffset(row->regSlot, &slotOffset))
                {
                    slotOffset = entryPointInfo->localVarSlotsOffset + slotOffset;
                    // If it was taken from the stack location, we should have arrived to the same stack location.
                    Assert(offset > 0 || offset == slotOffset);
                    row->offset = slotOffset;
                }
            });
        }
    }
}